

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAbbreviationDeclaration.cpp
# Opt level: O0

void __thiscall llvm::DWARFAbbreviationDeclaration::clear(DWARFAbbreviationDeclaration *this)

{
  DWARFAbbreviationDeclaration *this_local;
  
  this->Code = 0;
  this->Tag = DW_TAG_null;
  this->CodeByteSize = '\0';
  this->HasChildren = false;
  SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>::clear
            (&(this->AttributeSpecs).
              super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>);
  Optional<llvm::DWARFAbbreviationDeclaration::FixedSizeInfo>::reset(&this->FixedAttributeSize);
  return;
}

Assistant:

void DWARFAbbreviationDeclaration::clear() {
  Code = 0;
  Tag = DW_TAG_null;
  CodeByteSize = 0;
  HasChildren = false;
  AttributeSpecs.clear();
  FixedAttributeSize.reset();
}